

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::Camera::getProperties(Camera *this,Properties *prop,int id)

{
  double dVar1;
  size_type sVar2;
  Properties *in_RSI;
  long in_RDI;
  double dVar3;
  int in_stack_0000001c;
  char *in_stack_00000020;
  Camera *in_stack_00000028;
  SMatrix<double,_3,_3> *in_stack_00000030;
  char *in_stack_00000038;
  Properties *in_stack_00000040;
  char sep;
  string *in_stack_fffffffffffffe88;
  Properties *in_stack_fffffffffffffe90;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [40];
  Properties *local_10;
  
  local_10 = in_RSI;
  getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030);
  std::__cxx11::string::~string(local_38);
  getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<gmath::SVector<double,3>>
            (in_stack_00000040,in_stack_00000038,(SVector<double,_3> *)in_stack_00000030);
  std::__cxx11::string::~string(local_68);
  if (*(long *)(in_RDI + 0x28) != 0) {
    getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
    std::__cxx11::string::c_str();
    gutil::Properties::putValue<long>(in_stack_00000040,in_stack_00000038,(long *)in_stack_00000030)
    ;
    std::__cxx11::string::~string(local_88);
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
    std::__cxx11::string::c_str();
    gutil::Properties::putValue<long>(in_stack_00000040,in_stack_00000038,(long *)in_stack_00000030)
    ;
    std::__cxx11::string::~string(local_a8);
  }
  if ((*(double *)(in_RDI + 0x98) == 0.0) && (!NAN(*(double *)(in_RDI + 0x98)))) {
    dVar1 = *(double *)(in_RDI + 0xa0);
    dVar3 = std::numeric_limits<double>::max();
    if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) goto LAB_0012a3b2;
  }
  getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_00000040,in_stack_00000038,(double *)in_stack_00000030);
  std::__cxx11::string::~string(local_c8);
  in_stack_fffffffffffffe88 = local_e8;
  in_stack_fffffffffffffe90 = local_10;
  getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>
            (in_stack_00000040,in_stack_00000038,(double *)in_stack_00000030);
  std::__cxx11::string::~string(local_e8);
LAB_0012a3b2:
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0xa8));
  if (sVar2 != 0) {
    sep = (char)((ulong)local_108 >> 0x38);
    getCameraKey_abi_cxx11_(in_stack_00000028,in_stack_00000020,in_stack_0000001c);
    std::__cxx11::string::c_str();
    gutil::Properties::putStringVector
              (in_stack_fffffffffffffe90,(char *)in_stack_fffffffffffffe88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_10,sep);
    std::__cxx11::string::~string(local_108);
  }
  return;
}

Assistant:

void Camera::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("R", id).c_str(), R);
  prop.putValue(getCameraKey("T", id).c_str(), T);

  if (width != 0)
  {
    prop.putValue(getCameraKey("width", id).c_str(), width);
  }

  if (height != 0)
  {
    prop.putValue(getCameraKey("height", id).c_str(), height);
  }

  if (zmin != 0 || zmax != std::numeric_limits<double>::max())
  {
    prop.putValue(getCameraKey("zmin", id).c_str(), zmin);
    prop.putValue(getCameraKey("zmax", id).c_str(), zmax);
  }

  if (match.size() > 0)
  {
    prop.putStringVector(getCameraKey("match", id).c_str(), match, ',');
  }
}